

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

void init_keycodes(SWindowData_X11 *window_data_x11)

{
  int iVar1;
  long in_RDI;
  int keySym;
  size_t i;
  ulong local_10;
  
  for (local_10 = 0; local_10 < 0x200; local_10 = local_10 + 1) {
    g_keycodes[local_10] = -1;
  }
  for (local_10 = 8; local_10 < 0x100; local_10 = local_10 + 1) {
    iVar1 = XkbKeycodeToKeysym(*(undefined8 *)(in_RDI + 8),local_10 & 0xff,0,1);
    iVar1 = translateKeyCodeB(iVar1);
    g_keycodes[local_10] = (short)iVar1;
    if (g_keycodes[local_10] == -1) {
      iVar1 = XkbKeycodeToKeysym(*(undefined8 *)(in_RDI + 8),local_10 & 0xff,0);
      iVar1 = translateKeyCodeA(iVar1);
      g_keycodes[local_10] = (short)iVar1;
    }
  }
  return;
}

Assistant:

void
init_keycodes(SWindowData_X11 *window_data_x11) {
    size_t  i;
    int     keySym;

    // Clear keys
    for (i = 0; i < sizeof(g_keycodes) / sizeof(g_keycodes[0]); ++i)
        g_keycodes[i] = KB_KEY_UNKNOWN;

    // Valid key code range is  [8,255], according to the Xlib manual
    for (i=8; i<=255; ++i) {
        // Try secondary keysym, for numeric keypad keys
         keySym  = XkbKeycodeToKeysym(window_data_x11->display, i, 0, 1);
         g_keycodes[i] = translateKeyCodeB(keySym);
         if (g_keycodes[i] == KB_KEY_UNKNOWN) {
            keySym = XkbKeycodeToKeysym(window_data_x11->display, i, 0, 0);
            g_keycodes[i] = translateKeyCodeA(keySym);
         }
    }
}